

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::Parser::Parser(Parser *this)

{
  this->input_ = (Tokenizer *)0x0;
  this->error_collector_ = (ErrorCollector *)0x0;
  this->source_location_table_ = (SourceLocationTable *)0x0;
  *(undefined4 *)((long)&this->source_location_table_ + 7) = 0;
  (this->syntax_identifier_)._M_dataplus._M_p = (pointer)&(this->syntax_identifier_).field_2;
  (this->syntax_identifier_)._M_string_length = 0;
  (this->syntax_identifier_).field_2._M_local_buf[0] = '\0';
  (this->upcoming_doc_comments_)._M_dataplus._M_p = (pointer)&(this->upcoming_doc_comments_).field_2
  ;
  (this->upcoming_doc_comments_)._M_string_length = 0;
  (this->upcoming_doc_comments_).field_2._M_local_buf[0] = '\0';
  (this->upcoming_detached_comments_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->upcoming_detached_comments_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->upcoming_detached_comments_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Parser::Parser()
  : input_(NULL),
    error_collector_(NULL),
    source_location_table_(NULL),
    had_errors_(false),
    require_syntax_identifier_(false),
    stop_after_syntax_identifier_(false) {
}